

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O2

vec3 vec3_rotate_y(vec3 v,float theta)

{
  vec3 vVar1;
  
  vVar1 = vec3_rotate_about_axis(v,(vec3)ZEXT812(0x3f80000000000000),theta);
  return vVar1;
}

Assistant:

vec3 vec3_rotate_y(vec3 v, float theta) {
    return vec3_rotate_about_axis(v, V3(0.0f, 1.0f, 0.0f), theta);
}